

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O2

char * __thiscall
google::protobuf::internal::ParseContext::ParseMessage<google::protobuf::EnumValueDescriptorProto>
          (ParseContext *this,EnumValueDescriptorProto *msg,char *ptr)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  uint32 uVar5;
  uint uVar6;
  char *local_28;
  
  local_28 = ptr;
  uVar5 = ReadSize(&local_28);
  if (local_28 != (char *)0x0) {
    pcVar3 = (this->super_EpsCopyInputStream).buffer_end_;
    uVar6 = uVar5 + ((int)local_28 - (int)pcVar3);
    (this->super_EpsCopyInputStream).limit_end_ = pcVar3 + (int)((int)uVar6 >> 0x1f & uVar6);
    iVar1 = (this->super_EpsCopyInputStream).limit_;
    (this->super_EpsCopyInputStream).limit_ = uVar6;
    iVar2 = this->depth_;
    this->depth_ = iVar2 + -1;
    if ((0 < iVar2) &&
       (local_28 = EnumValueDescriptorProto::_InternalParse(msg,local_28,this),
       local_28 != (char *)0x0)) {
      this->depth_ = this->depth_ + 1;
      bVar4 = EpsCopyInputStream::PopLimit(&this->super_EpsCopyInputStream,iVar1 - uVar6);
      if (bVar4) {
        return local_28;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

PROTOBUF_MUST_USE_RESULT const char* ParseContext::ParseMessage(
    T* msg, const char* ptr) {
  int size = ReadSize(&ptr);
  if (!ptr) return nullptr;
  auto old = PushLimit(ptr, size);
  if (--depth_ < 0) return nullptr;
  ptr = msg->_InternalParse(ptr, this);
  if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
  depth_++;
  if (!PopLimit(old)) return nullptr;
  return ptr;
}